

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.cpp
# Opt level: O1

shared_ptr<mocker::ast::Type> __thiscall
mocker::ir::BuilderContext::getExprType(BuilderContext *this,NodeID id)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  mapped_type *pmVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::ast::Type> sVar3;
  key_type local_10;
  
  pmVar2 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at(*(_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  **)(id + 0x58),&local_10);
  *(element_type **)&this->logicalExprInfo =
       (pmVar2->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (pmVar2->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->logicalExprInfo).trueNext._M_node = (_List_node_base *)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  sVar3.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::Type>)
         sVar3.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

const std::shared_ptr<ast::Type>
BuilderContext::getExprType(ast::NodeID id) const {
  return exprType.at(id);
}